

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoop(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  uintptr_t uVar2;
  FunctionCreationContext *pFVar3;
  Id IVar4;
  undefined7 uVar5;
  uint32_t uVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Block *pBVar10;
  Expression EVar11;
  optional<wasm::Type> type_00;
  Expression *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> list;
  
  pEVar7 = (Expression *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  pEVar7->_id = LoopId;
  *(undefined8 *)(pEVar7 + 1) = 0;
  pEVar7[1].type.id = 0;
  (pEVar7->type).id = type.id;
  EVar11 = (Expression)makeLabel(this);
  pEVar7[1] = EVar11;
  auStack_48 = (undefined1  [8])pEVar7;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->breakableStack,(Expression **)auStack_48);
  auStack_48 = (undefined1  [8])pEVar7;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->hangStack,(Expression **)auStack_48);
  uVar6 = Random::upTo(&this->random,2);
  if (uVar6 == 0) {
    pEVar8 = makeMaybeBlock(this,type);
    *(Expression **)(pEVar7 + 2) = pEVar8;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = makeMaybeBlock(this,(Type)0x0);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,&local_50);
    IVar4 = pEVar7[1]._id;
    uVar5 = *(undefined7 *)&pEVar7[1].field_0x1;
    uVar2 = pEVar7[1].type.id;
    pEVar8 = makeCondition(this);
    pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
    pEVar9->_id = BreakId;
    (pEVar9->type).id = 1;
    pEVar9[1]._id = IVar4;
    *(undefined7 *)&pEVar9[1].field_0x1 = uVar5;
    pEVar9[1].type.id = uVar2;
    *(undefined8 *)(pEVar9 + 2) = 0;
    pEVar9[2].type.id = (uintptr_t)pEVar8;
    wasm::Break::finalize();
    local_50 = pEVar9;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,&local_50);
    local_50 = make(this,type);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,&local_50);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)type.id;
    pBVar10 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        (&this->builder,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_48,type_00);
    *(Block **)(pEVar7 + 2) = pBVar10;
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)list.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  pFVar3 = this->funcContext;
  pppEVar1 = &(pFVar3->breakableStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  pppEVar1 = &(pFVar3->hangStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  wasm::Loop::finalize(pEVar7,type.id,1);
  return pEVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoop(Type type) {
  auto* ret = wasm.allocator.alloc<Loop>();
  ret->type = type; // So we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  funcContext->hangStack.push_back(ret);
  // Either create random content, or do something more targeted
  if (oneIn(2)) {
    ret->body = makeMaybeBlock(type);
  } else {
    // Ensure a branch back. Also optionally create some loop vars.
    std::vector<Expression*> list;
    list.push_back(makeMaybeBlock(Type::none)); // Primary contents
    // Possible branch back
    list.push_back(builder.makeBreak(ret->name, nullptr, makeCondition()));
    list.push_back(make(type)); // Final element, so we have the right type
    ret->body = builder.makeBlock(list, type);
  }
  funcContext->breakableStack.pop_back();
  funcContext->hangStack.pop_back();
  ret->finalize(type);
  return ret;
}